

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticCost.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::QuadraticCost::setControlHessianSparsity
          (QuadraticCost *this,SparsityStructure *controlSparsity)

{
  SparsityStructure *this_00;
  bool bVar1;
  
  bVar1 = SparsityStructure::isValid(controlSparsity);
  if (bVar1) {
    (this->super_QuadraticLikeCost).m_hasSecondPartialDerivativeWRTControlSparsity = true;
    this_00 = &(this->super_QuadraticLikeCost).m_secondPartialDerivativeWRTControlSparsity;
    if (this_00 != controlSparsity) {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this_00,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)controlSparsity);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(this->super_QuadraticLikeCost).m_secondPartialDerivativeWRTControlSparsity.
                m_nonZeroElementRows,&controlSparsity->m_nonZeroElementRows);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(this->super_QuadraticLikeCost).m_secondPartialDerivativeWRTControlSparsity.
                m_nonZeroElementColumns,&controlSparsity->m_nonZeroElementColumns);
  }
  else {
    iDynTree::reportError
              ("QuadraticCost","setControlHessianSparsity",
               "The sparsity vectors have different number of entries.");
  }
  return bVar1;
}

Assistant:

bool QuadraticCost::setControlHessianSparsity(const SparsityStructure &controlSparsity)
        {
            if (!controlSparsity.isValid()) {
                reportError("QuadraticCost", "setControlHessianSparsity", "The sparsity vectors have different number of entries.");
                return false;
            }
            m_hasSecondPartialDerivativeWRTControlSparsity = true;
            m_secondPartialDerivativeWRTControlSparsity = controlSparsity;
            return true;
        }